

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMap<QByteArray,_QByteArray>::insert
          (QMap<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *value)

{
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QByteArray,_QByteArray>_>,_bool> pVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_28.d.ptr ==
       (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
           *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_*>
          )(QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
       *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                        *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pVar1 = std::
          map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
          ::insert_or_assign<QByteArray_const&>
                    ((map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
                      *)&((this->d).d.ptr)->m,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(_Base_ptr)pVar1.first._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }